

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  int iVar2;
  char *__s;
  pointer *__ptr;
  string flatbuffers_version;
  _Head_base<0UL,_flatbuffers::CodeGenerator_*,_false> local_608;
  FlatCompiler local_600;
  undefined1 local_5c0 [32];
  _Alloc_hider local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  _Alloc_hider local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  _Alloc_hider local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550 [61];
  shared_ptr<flatbuffers::CodeGenerator> local_180;
  shared_ptr<flatbuffers::CodeGenerator> local_170;
  shared_ptr<flatbuffers::CodeGenerator> local_160;
  shared_ptr<flatbuffers::CodeGenerator> local_150;
  shared_ptr<flatbuffers::CodeGenerator> local_140;
  shared_ptr<flatbuffers::CodeGenerator> local_130;
  shared_ptr<flatbuffers::CodeGenerator> local_120;
  shared_ptr<flatbuffers::CodeGenerator> local_110;
  shared_ptr<flatbuffers::CodeGenerator> local_100;
  shared_ptr<flatbuffers::CodeGenerator> local_f0;
  shared_ptr<flatbuffers::CodeGenerator> local_e0;
  shared_ptr<flatbuffers::CodeGenerator> local_d0;
  shared_ptr<flatbuffers::CodeGenerator> local_c0;
  shared_ptr<flatbuffers::CodeGenerator> local_b0;
  shared_ptr<flatbuffers::CodeGenerator> local_a0;
  shared_ptr<flatbuffers::CodeGenerator> local_90;
  shared_ptr<flatbuffers::CodeGenerator> local_80;
  shared_ptr<flatbuffers::CodeGenerator> local_70;
  shared_ptr<flatbuffers::CodeGenerator> local_60;
  string local_50;
  
  __s = flatbuffers::FLATBUFFERS_VERSION();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__s,(allocator<char> *)local_5c0);
  g_program_name = *argv;
  local_600.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_600.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_600.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_600.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_600.code_generators_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_600.params_.warn_fn = Warn;
  local_600.params_.error_fn = Error;
  pcVar1 = local_5c0 + 0x10;
  local_600.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_600.code_generators_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"b","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"binary","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate wire format binaries for any data definitions","");
  flatbuffers::NewBinaryCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_60);
  if (local_60.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"c","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"cpp","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate C++ headers for tables/structs","");
  flatbuffers::NewCppCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_70);
  if (local_70.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"n","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"csharp","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate C# classes for tables/structs","");
  flatbuffers::NewCSharpCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_80,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_80);
  if (local_80.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"d","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"dart","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Dart classes for tables/structs","");
  flatbuffers::NewDartCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_90);
  if (local_90.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"proto","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Input is a .proto, translate to .fbs","");
  flatbuffers::NewFBSCodeGenerator((flatbuffers *)&local_608,false);
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_a0);
  if (local_a0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"g","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"go","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Go files for tables/structs","");
  flatbuffers::NewGoCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_b0);
  if (local_b0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"j","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"java","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Java classes for tables/structs","");
  flatbuffers::NewJavaCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_c0);
  if (local_c0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"jsonschema","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"Generate Json schema","");
  flatbuffers::NewJsonSchemaCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_d0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_d0);
  if (local_d0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"kotlin","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Kotlin classes for tables/structs","");
  flatbuffers::NewKotlinCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_e0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_e0);
  if (local_e0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"kotlin-kmp","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Kotlin multiplatform classes for tables/structs","");
  flatbuffers::NewKotlinKMPCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_f0,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_f0);
  if (local_f0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"lobster","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Lobster files for tables/structs","");
  flatbuffers::NewLobsterCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_100,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_100);
  if (local_100.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"l","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"lua","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Lua files for tables/structs","");
  flatbuffers::NewLuaBfbsGenerator((flatbuffers *)&local_608,&local_50);
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_110,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_110);
  if (local_110.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"nim","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Nim files for tables/structs","");
  flatbuffers::NewNimBfbsGenerator((flatbuffers *)&local_608,&local_50);
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_120,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_120);
  if (local_120.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"p","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"python","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Python files for tables/structs","");
  flatbuffers::NewPythonCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_130,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_130);
  if (local_130.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"php","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate PHP files for tables/structs","");
  flatbuffers::NewPhpCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_140,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_140);
  if (local_140.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"r","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"rust","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Rust files for tables/structs","");
  flatbuffers::NewRustCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_150,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_150);
  if (local_150.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"t","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"json","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate text output for any data definitions","");
  flatbuffers::NewTextCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_160,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_160);
  if (local_160.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"swift","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate Swift files for tables/structs","");
  flatbuffers::NewSwiftCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_170,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_170);
  if (local_170.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  local_5c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"T","");
  local_5a0._M_p = (pointer)&local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"ts","");
  local_580._M_p = (pointer)&local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"");
  local_560._M_p = (pointer)local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_560,"Generate TypeScript code for tables/structs","");
  flatbuffers::NewTsCodeGenerator();
  std::__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>,void>
            ((__shared_ptr<flatbuffers::CodeGenerator,(__gnu_cxx::_Lock_policy)2> *)&local_180,
             (unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
              *)&local_608);
  flatbuffers::FlatCompiler::RegisterCodeGenerator(&local_600,(FlatCOption *)local_5c0,&local_180);
  if (local_180.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_608._M_head_impl != (CodeGenerator *)0x0) {
    (*(local_608._M_head_impl)->_vptr_CodeGenerator[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_p != local_550) {
    operator_delete(local_560._M_p,local_550[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((pointer)local_5c0._0_8_ != pcVar1) {
    operator_delete((void *)local_5c0._0_8_,local_5c0._16_8_ + 1);
  }
  flatbuffers::FlatCompiler::ParseFromCommandLineArguments
            ((FlatCOptions *)local_5c0,&local_600,argc,argv);
  iVar2 = flatbuffers::FlatCompiler::Compile(&local_600,(FlatCOptions *)local_5c0);
  flatbuffers::FlatCOptions::~FlatCOptions((FlatCOptions *)local_5c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
               *)&local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[]) {
  const std::string flatbuffers_version(flatbuffers::FLATBUFFERS_VERSION());

  g_program_name = argv[0];

  flatbuffers::FlatCompiler::InitParams params;
  params.warn_fn = Warn;
  params.error_fn = Error;

  flatbuffers::FlatCompiler flatc(params);

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{
          "b", "binary", "",
          "Generate wire format binaries for any data definitions" },
      flatbuffers::NewBinaryCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "c", "cpp", "",
                                "Generate C++ headers for tables/structs" },
      flatbuffers::NewCppCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "n", "csharp", "",
                                "Generate C# classes for tables/structs" },
      flatbuffers::NewCSharpCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "d", "dart", "",
                                "Generate Dart classes for tables/structs" },
      flatbuffers::NewDartCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "proto", "",
                                "Input is a .proto, translate to .fbs" },
      flatbuffers::NewFBSCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "g", "go", "",
                                "Generate Go files for tables/structs" },
      flatbuffers::NewGoCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "j", "java", "",
                                "Generate Java classes for tables/structs" },
      flatbuffers::NewJavaCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "jsonschema", "", "Generate Json schema" },
      flatbuffers::NewJsonSchemaCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "kotlin", "",
                                "Generate Kotlin classes for tables/structs" },
      flatbuffers::NewKotlinCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "kotlin-kmp", "",
                                "Generate Kotlin multiplatform classes for tables/structs" },
      flatbuffers::NewKotlinKMPCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "lobster", "",
                                "Generate Lobster files for tables/structs" },
      flatbuffers::NewLobsterCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "l", "lua", "",
                                "Generate Lua files for tables/structs" },
      flatbuffers::NewLuaBfbsGenerator(flatbuffers_version));

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "nim", "",
                                "Generate Nim files for tables/structs" },
      flatbuffers::NewNimBfbsGenerator(flatbuffers_version));

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "p", "python", "",
                                "Generate Python files for tables/structs" },
      flatbuffers::NewPythonCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "php", "",
                                "Generate PHP files for tables/structs" },
      flatbuffers::NewPhpCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "r", "rust", "",
                                "Generate Rust files for tables/structs" },
      flatbuffers::NewRustCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{
          "t", "json", "", "Generate text output for any data definitions" },
      flatbuffers::NewTextCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "", "swift", "",
                                "Generate Swift files for tables/structs" },
      flatbuffers::NewSwiftCodeGenerator());

  flatc.RegisterCodeGenerator(
      flatbuffers::FlatCOption{ "T", "ts", "",
                                "Generate TypeScript code for tables/structs" },
      flatbuffers::NewTsCodeGenerator());

  // Create the FlatC options by parsing the command line arguments.
  const flatbuffers::FlatCOptions &options =
      flatc.ParseFromCommandLineArguments(argc, argv);

  // Compile with the extracted FlatC options.
  return flatc.Compile(options);
}